

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O3

void plutovg_matrix_multiply
               (plutovg_matrix_t *matrix,plutovg_matrix_t *left,plutovg_matrix_t *right)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  uVar7 = right->a;
  uVar10 = right->b;
  uVar8 = right->c;
  uVar11 = right->d;
  uVar9 = right->e;
  uVar12 = right->f;
  fVar1 = left->f;
  fVar2 = left->e;
  fVar3 = left->a;
  fVar4 = left->b;
  fVar5 = left->c;
  fVar6 = left->d;
  matrix->a = fVar4 * (float)uVar8 + fVar3 * (float)uVar7;
  matrix->b = fVar4 * (float)uVar11 + fVar3 * (float)uVar10;
  matrix->c = fVar6 * (float)uVar8 + fVar5 * (float)uVar7;
  matrix->d = fVar6 * (float)uVar11 + fVar5 * (float)uVar10;
  matrix->e = fVar2 * (float)uVar7 + fVar1 * (float)uVar8 + (float)uVar9;
  matrix->f = fVar2 * (float)uVar10 + fVar1 * (float)uVar11 + (float)uVar12;
  return;
}

Assistant:

void plutovg_matrix_multiply(plutovg_matrix_t* matrix, const plutovg_matrix_t* left, const plutovg_matrix_t* right)
{
    float a = left->a * right->a + left->b * right->c;
    float b = left->a * right->b + left->b * right->d;
    float c = left->c * right->a + left->d * right->c;
    float d = left->c * right->b + left->d * right->d;
    float e = left->e * right->a + left->f * right->c + right->e;
    float f = left->e * right->b + left->f * right->d + right->f;
    plutovg_matrix_init(matrix, a, b, c, d, e, f);
}